

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::makeLvec(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int p_len,int p_row)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  int in_EDX;
  int in_ESI;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  int first;
  int *p_lbeg;
  int *p_lrow;
  int in_stack_ffffffffffffffcc;
  
  if ((in_RDI->l).startSize <= (in_RDI->l).firstUnused) {
    (in_RDI->l).startSize = (in_RDI->l).startSize + 100;
    spx_realloc<int*>((int **)p_lrow,p_lbeg._4_4_);
  }
  piVar2 = (in_RDI->l).row;
  iVar1 = (in_RDI->l).start[(in_RDI->l).firstUnused];
  minLMem(in_RDI,in_stack_ffffffffffffffcc);
  piVar2[(in_RDI->l).firstUnused] = in_EDX;
  iVar3 = (in_RDI->l).firstUnused + 1;
  (in_RDI->l).firstUnused = iVar3;
  (in_RDI->l).start[iVar3] = iVar1 + in_ESI;
  return iVar1;
}

Assistant:

int CLUFactor<R>::makeLvec(int p_len, int p_row)
{

   if(l.firstUnused >= l.startSize)
   {
      l.startSize += 100;
      spx_realloc(l.start, l.startSize);
   }

   int* p_lrow = l.row;

   int* p_lbeg = l.start;
   int first   = p_lbeg[l.firstUnused];

   assert(p_len > 0 && "ERROR: no empty columns allowed in L vectors");

   minLMem(first + p_len);
   p_lrow[l.firstUnused] = p_row;
   l.start[++(l.firstUnused)] = first + p_len;

   assert(l.start[l.firstUnused] <= l.size);
   assert(l.firstUnused <= l.startSize);
   return first;
}